

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

bool __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::dump_to_stream
          (array_n<char,_3,_std::allocator<char>_> *this,ofstream *stream)

{
  int iVar1;
  long lVar2;
  uint sig;
  
  iVar1 = *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
  if (iVar1 == 0) {
    sig = 0x53534c41;
    for (lVar2 = 2; lVar2 != 5; lVar2 = lVar2 + 1) {
    }
    std::ostream::write((char *)stream,(long)&sig);
    std::ostream::write((char *)stream,(long)this->_dims);
    std::ostream::write((char *)stream,(long)this->_array);
  }
  return iVar1 == 0;
}

Assistant:

bool dump_to_stream(std::ofstream &stream) const {
            if(!stream.good()) return false;

            unsigned int sig = 0x53534c41; // TODO: Move this sig out into a DEFINE

            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            stream.write((const char *)&sig, sizeof(unsigned int));
            stream.write((const char *)&_dims[0], N*sizeof(unsigned int));
            stream.write((const char *)_array, size*sizeof(T));

            return true;
        }